

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

bool qUnregisterResourceData(int version,uchar *tree,uchar *name,uchar *data)

{
  QAtomicInt *pQVar1;
  QResourceRoot *pQVar2;
  bool bVar3;
  QRecursiveMutex *this;
  ResourceList *this_00;
  int i;
  uint uVar4;
  char *__filename;
  long in_FS_OFFSET;
  bool bVar5;
  QResourceRoot local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1) {
    bVar5 = false;
  }
  else {
    this = resourceMutex();
    QRecursiveMutex::lock(this);
    bVar5 = version - 1U < 3;
    if (bVar5) {
      local_60._vptr_QResourceRoot = (_func_int **)&PTR__QResourceRoot_00661f58;
      local_60.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = (QAtomicInteger<int>)(QBasicAtomicInteger<int>)0x0;
      uVar4 = 0;
      local_60.tree = tree;
      local_60.names = name;
      local_60.payloads = data;
      local_60.version = version;
      this_00 = resourceList();
      do {
        __filename = (char *)(ulong)uVar4;
        while( true ) {
          if ((char *)(this_00->d).size <= __filename) goto LAB_0023787a;
          bVar3 = anon_unknown.dwarf_3f5684::QResourceRoot::operator==
                            ((this_00->d).ptr[(long)__filename],&local_60);
          if (!bVar3) break;
          QList<(anonymous_namespace)::QResourceRoot_*>::detach(this_00);
          pQVar2 = (this_00->d).ptr[(long)__filename];
          QList<(anonymous_namespace)::QResourceRoot_*>::remove(this_00,__filename);
          LOCK();
          pQVar1 = &pQVar2->ref;
          (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (pQVar2 != (QResourceRoot *)0x0 &&
              (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i == 0) {
            (*pQVar2->_vptr_QResourceRoot[1])(pQVar2);
          }
        }
        uVar4 = uVar4 + 1;
      } while( true );
    }
LAB_0023787a:
    QRecursiveMutex::unlock(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

Q_CORE_EXPORT bool qUnregisterResourceData(int version, const unsigned char *tree,
                                           const unsigned char *name, const unsigned char *data)
{
    if (resourceGlobalData.isDestroyed())
        return false;

    const auto locker = qt_scoped_lock(resourceMutex());
    if (version >= 0x01 && version <= 0x3) {
        QResourceRoot res(version, tree, name, data);
        ResourceList *list = resourceList();
        for (int i = 0; i < list->size();) {
            if (*list->at(i) == res) {
                QResourceRoot *root = list->takeAt(i);
                if (!root->ref.deref())
                    delete root;
            } else {
                ++i;
            }
        }
        return true;
    }
    return false;
}